

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindContainer(Node *node)

{
  Bool BVar1;
  bool bVar2;
  Node *local_18;
  Node *local_10;
  Node *node_local;
  
  if (node == (Node *)0x0) {
    local_18 = (Node *)0x0;
  }
  else {
    local_18 = node->parent;
  }
  local_10 = local_18;
  while( true ) {
    bVar2 = false;
    if (local_10 != (Node *)0x0) {
      BVar1 = prvTidynodeHasCM(local_10,0x10);
      bVar2 = BVar1 != no;
    }
    if (!bVar2) break;
    local_10 = local_10->parent;
  }
  return local_10;
}

Assistant:

Node* TY_(FindContainer)( Node* node )
{
    for ( node = (node ? node->parent : NULL);
          node && TY_(nodeHasCM)(node, CM_INLINE);
          node = node->parent )
        /**/;

    return node;
}